

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O2

int nni_msgq_tryput(nni_msgq *mq,nni_msg *msg)

{
  uint uVar1;
  uint uVar2;
  nni_aio *aio;
  uint uVar3;
  int iVar4;
  
  nni_mtx_lock(&mq->mq_lock);
  if (mq->mq_closed == false) {
    aio = (nni_aio *)nni_list_first(&mq->mq_aio_getq);
    if (aio == (nni_aio *)0x0) {
      uVar1 = mq->mq_len;
      if (mq->mq_cap <= uVar1) {
        iVar4 = 8;
        goto LAB_00128999;
      }
      uVar2 = mq->mq_put;
      uVar3 = uVar2 + 1;
      mq->mq_put = uVar3;
      mq->mq_msgs[uVar2] = msg;
      if (uVar3 == mq->mq_alloc) {
        mq->mq_put = 0;
      }
      mq->mq_len = uVar1 + 1;
    }
    else {
      nni_list_remove(&mq->mq_aio_getq,aio);
      nni_aio_finish_msg(aio,msg);
    }
    nni_msgq_run_notify(mq);
    iVar4 = 0;
  }
  else {
    iVar4 = 7;
  }
LAB_00128999:
  nni_mtx_unlock(&mq->mq_lock);
  return iVar4;
}

Assistant:

int
nni_msgq_tryput(nni_msgq *mq, nni_msg *msg)
{
	nni_aio *raio;

	nni_mtx_lock(&mq->mq_lock);
	if (mq->mq_closed) {
		nni_mtx_unlock(&mq->mq_lock);
		return (NNG_ECLOSED);
	}

	// The presence of any blocked reader indicates that
	// the queue is empty, otherwise it would have just taken
	// data from the queue.
	if ((raio = nni_list_first(&mq->mq_aio_getq)) != NULL) {

		nni_list_remove(&mq->mq_aio_getq, raio);
		nni_aio_finish_msg(raio, msg);
		nni_msgq_run_notify(mq);
		nni_mtx_unlock(&mq->mq_lock);
		return (0);
	}

	// Otherwise if we have room in the buffer, just queue it.
	if (mq->mq_len < mq->mq_cap) {
		mq->mq_msgs[mq->mq_put++] = msg;
		if (mq->mq_put == mq->mq_alloc) {
			mq->mq_put = 0;
		}
		mq->mq_len++;
		nni_msgq_run_notify(mq);
		nni_mtx_unlock(&mq->mq_lock);
		return (0);
	}

	nni_mtx_unlock(&mq->mq_lock);
	return (NNG_EAGAIN);
}